

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_byte_array_len_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte *pbVar1;
  cram_codec *pcVar2;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  cram_encoding local_3c;
  int32_t sub_size;
  int32_t encoding;
  char *cp;
  cram_codec *c;
  int version_local;
  cram_external_type option_local;
  int size_local;
  char *data_local;
  
  data_local = (char *)malloc(0x240);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    data_local[0] = '\x04';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    *(code **)(data_local + 0x18) = cram_byte_array_len_decode;
    *(code **)(data_local + 0x10) = cram_byte_array_len_decode_free;
    if ((byte)*data < 0x80) {
      local_3c = (cram_encoding)(byte)*data;
      local_44 = 1;
    }
    else {
      if ((byte)*data < 0xc0) {
        local_3c = CONCAT11(*data,data[1]) & 0x3fff;
        local_48 = 2;
      }
      else {
        if ((byte)*data < 0xe0) {
          local_3c = ((byte)*data & 0x1f) << 0x10 | (uint)(byte)data[1] << 8 | (uint)(byte)data[2];
          local_4c = 3;
        }
        else {
          if ((byte)*data < 0xf0) {
            local_3c = ((byte)*data & 0xf) << 0x18 | (uint)(byte)data[1] << 0x10 |
                       (uint)(byte)data[2] << 8 | (uint)(byte)data[3];
            local_50 = 4;
          }
          else {
            local_3c = (uint)(byte)*data << 0x1c | (uint)(byte)data[1] << 0x14 |
                       (uint)(byte)data[2] << 0xc | (uint)(byte)data[3] << 4 |
                       (byte)data[4] & (E_GOLOMB_RICE|E_SUBEXP);
            local_50 = 5;
          }
          local_4c = local_50;
        }
        local_48 = local_4c;
      }
      local_44 = local_48;
    }
    pbVar1 = (byte *)(data + local_44);
    if (*pbVar1 < 0x80) {
      local_40 = (uint)*pbVar1;
      local_54 = 1;
    }
    else {
      if (*pbVar1 < 0xc0) {
        local_40 = CONCAT11(*pbVar1,pbVar1[1]) & 0x3fff;
        local_58 = 2;
      }
      else {
        if (*pbVar1 < 0xe0) {
          local_40 = (*pbVar1 & 0x1f) << 0x10 | (uint)pbVar1[1] << 8 | (uint)pbVar1[2];
          local_5c = 3;
        }
        else {
          if (*pbVar1 < 0xf0) {
            local_40 = (*pbVar1 & 0xf) << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 |
                       (uint)pbVar1[3];
            local_60 = 4;
          }
          else {
            local_40 = (uint)*pbVar1 << 0x1c | (uint)pbVar1[1] << 0x14 | (uint)pbVar1[2] << 0xc |
                       (uint)pbVar1[3] << 4 | pbVar1[4] & 0xf;
            local_60 = 5;
          }
          local_5c = local_60;
        }
        local_58 = local_5c;
      }
      local_54 = local_58;
    }
    pcVar2 = cram_decoder_init(local_3c,(char *)(pbVar1 + local_54),local_40,E_INT,version);
    *(cram_codec **)(data_local + 0x30) = pcVar2;
    pbVar1 = pbVar1 + local_54 + (int)local_40;
    if (*pbVar1 < 0x80) {
      local_3c = (cram_encoding)*pbVar1;
      local_64 = 1;
    }
    else {
      if (*pbVar1 < 0xc0) {
        local_3c = CONCAT11(*pbVar1,pbVar1[1]) & 0x3fff;
        local_68 = 2;
      }
      else {
        if (*pbVar1 < 0xe0) {
          local_3c = (*pbVar1 & 0x1f) << 0x10 | (uint)pbVar1[1] << 8 | (uint)pbVar1[2];
          local_6c = 3;
        }
        else {
          if (*pbVar1 < 0xf0) {
            local_3c = (*pbVar1 & 0xf) << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 |
                       (uint)pbVar1[3];
            local_70 = 4;
          }
          else {
            local_3c = (uint)*pbVar1 << 0x1c | (uint)pbVar1[1] << 0x14 | (uint)pbVar1[2] << 0xc |
                       (uint)pbVar1[3] << 4 | pbVar1[4] & (E_GOLOMB_RICE|E_SUBEXP);
            local_70 = 5;
          }
          local_6c = local_70;
        }
        local_68 = local_6c;
      }
      local_64 = local_68;
    }
    pbVar1 = pbVar1 + local_64;
    if (*pbVar1 < 0x80) {
      local_40 = (uint)*pbVar1;
      local_74 = 1;
    }
    else {
      if (*pbVar1 < 0xc0) {
        local_40 = CONCAT11(*pbVar1,pbVar1[1]) & 0x3fff;
        local_78 = 2;
      }
      else {
        if (*pbVar1 < 0xe0) {
          local_40 = (*pbVar1 & 0x1f) << 0x10 | (uint)pbVar1[1] << 8 | (uint)pbVar1[2];
          local_7c = 3;
        }
        else {
          if (*pbVar1 < 0xf0) {
            local_40 = (*pbVar1 & 0xf) << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 |
                       (uint)pbVar1[3];
            local_80 = 4;
          }
          else {
            local_40 = (uint)*pbVar1 << 0x1c | (uint)pbVar1[1] << 0x14 | (uint)pbVar1[2] << 0xc |
                       (uint)pbVar1[3] << 4 | pbVar1[4] & 0xf;
            local_80 = 5;
          }
          local_7c = local_80;
        }
        local_78 = local_7c;
      }
      local_74 = local_78;
    }
    pcVar2 = cram_decoder_init(local_3c,(char *)(pbVar1 + local_74),local_40,option,version);
    *(cram_codec **)(data_local + 0x38) = pcVar2;
    if (pbVar1 + local_74 + ((long)(int)local_40 - (long)data) != (byte *)(long)size) {
      fprintf(_stderr,"Malformed byte_array_len header stream\n");
      free(data_local);
      data_local = (char *)0x0;
    }
  }
  return (cram_codec *)data_local;
}

Assistant:

cram_codec *cram_byte_array_len_decode_init(char *data, int size,
					    enum cram_external_type option,
					    int version) {
    cram_codec *c;
    char *cp = data;
    int32_t encoding;
    int32_t sub_size;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BYTE_ARRAY_LEN;
    c->decode = cram_byte_array_len_decode;
    c->free   = cram_byte_array_len_decode_free;
    
    cp += itf8_get(cp, &encoding);
    cp += itf8_get(cp, &sub_size);
    c->byte_array_len.len_codec = cram_decoder_init(encoding, cp, sub_size,
						    E_INT, version);
    cp += sub_size;

    cp += itf8_get(cp, &encoding);
    cp += itf8_get(cp, &sub_size);
    c->byte_array_len.value_codec = cram_decoder_init(encoding, cp, sub_size,
						      option, version);
    cp += sub_size;

    if (cp - data != size) {
	fprintf(stderr, "Malformed byte_array_len header stream\n");
	free(c);
	return NULL;
    }

    return c;
}